

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::ScaleLayerParams::_internal_add_shapebias
          (ScaleLayerParams *this,uint64_t value)

{
  uint64_t local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->shapebias_,&local_8);
  return;
}

Assistant:

inline void ScaleLayerParams::_internal_add_shapebias(uint64_t value) {
  shapebias_.Add(value);
}